

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

int * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
consume_operation::element<int>(consume_operation *this)

{
  runtime_type<> *prVar1;
  int *piVar2;
  
  if (this->m_control != (ControlBlock *)0x0) {
    prVar1 = complete_type(this);
    if (prVar1->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) goto LAB_00a76519;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
             ,0x415);
LAB_00a76519:
  piVar2 = (int *)heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  get_element(this->m_control);
  return piVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(get_element(m_control));
            }